

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string * pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_(wchar_t *str,size_t length)

{
  size_t sVar1;
  string *in_RDI;
  size_t size;
  string *result;
  size_t in_stack_ffffffffffffffa8;
  wchar_t *in_stack_ffffffffffffffb0;
  string *this;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  sVar1 = anon_unknown_0::as_utf8_begin(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::string(this);
  std::__cxx11::string::resize((ulong)this);
  if (sVar1 != 0) {
    std::__cxx11::string::operator[]((ulong)this);
    anon_unknown_0::as_utf8_end
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(wchar_t *)this,(size_t)in_RDI);
  }
  return in_RDI;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}